

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

void __thiscall
QFileSystemModelPrivate::sortChildren(QFileSystemModelPrivate *this,int column,QModelIndex *parent)

{
  iterator __last;
  bool bVar1;
  int iVar2;
  QModelIndex *parent_00;
  QFileSystemModelPrivate *pQVar3;
  qsizetype qVar4;
  QFileSystemNode **ppQVar5;
  QFileSystemNode *pQVar6;
  undefined8 in_RDX;
  undefined4 in_ESI;
  QFileSystemModelPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileSystemNode *indexNode_1;
  int i;
  QFileSystemNode *node;
  add_const_t<QList<QFileSystemModelPrivate::QFileSystemNode_*>_> *__range1;
  QFileSystemNode *indexNode;
  QFileSystemModel *q;
  QModelIndex childIndex;
  const_iterator __end1;
  const_iterator __begin1;
  const_iterator cend;
  const_iterator iterator;
  QList<QFileSystemModelPrivate::QFileSystemNode_*> values;
  QFileSystemModelSorter ms;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  QFileSystemModelPrivate *in_stack_ffffffffffffff08;
  QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int iVar7;
  int iVar8;
  iterator in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff60;
  QFileSystemModelPrivate *asize;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  QFileSystemNode **local_78;
  const_iterator local_70;
  const_iterator local_68;
  undefined1 *local_60;
  QList<QFileSystemModelPrivate::QFileSystemNode_*> local_40;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  asize = in_RDI;
  parent_00 = (QModelIndex *)q_func(in_RDI);
  pQVar3 = (QFileSystemModelPrivate *)
           QFileSystemModelPrivate::node
                     (in_stack_ffffffffffffff08,
                      (QModelIndex *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  qVar4 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::size
                    ((QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *)
                     &pQVar3->field_0x18);
  if (qVar4 != 0) {
    local_40.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_40.d.ptr = (QFileSystemNode **)&DAT_aaaaaaaaaaaaaaaa;
    local_40.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QFileSystemModelPrivate::QFileSystemNode_*>::QList
              ((QList<QFileSystemModelPrivate::QFileSystemNode_*> *)0xaa6785);
    QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::constBegin
              (in_stack_ffffffffffffff18);
    stack0xffffffffffffffa8 = (QFileSystemNode *)&DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    _local_60 = (piter)QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::constEnd
                                 ((QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *)
                                  in_stack_ffffffffffffff08);
    while (bVar1 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::const_iterator::
                   operator!=((const_iterator *)in_stack_ffffffffffffff08,
                              (const_iterator *)
                              CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)), bVar1)
    {
      QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::const_iterator::value
                ((const_iterator *)0xaa6825);
      bVar1 = filtersAcceptsNode(pQVar3,stack0xffffffffffffffa8);
      if (bVar1) {
        QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::const_iterator::value
                  ((const_iterator *)0xaa6845);
        QList<QFileSystemModelPrivate::QFileSystemNode_*>::append
                  ((QList<QFileSystemModelPrivate::QFileSystemNode_*> *)0xaa6855,
                   (parameter_type)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      }
      else {
        ppQVar5 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::const_iterator::value
                            ((const_iterator *)0xaa6864);
        (*ppQVar5)->isVisible = false;
      }
      QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::const_iterator::operator++
                ((const_iterator *)in_RDI);
    }
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QFileSystemModelSorter::QFileSystemModelSorter
              ((QFileSystemModelSorter *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffefc);
    QList<QFileSystemModelPrivate::QFileSystemNode_*>::begin
              ((QList<QFileSystemModelPrivate::QFileSystemNode_*> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    QList<QFileSystemModelPrivate::QFileSystemNode_*>::end
              ((QList<QFileSystemModelPrivate::QFileSystemNode_*> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    QFileSystemModelSorter::QFileSystemModelSorter
              ((QFileSystemModelSorter *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (QFileSystemModelSorter *)
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    __last.i._4_4_ = in_stack_ffffffffffffff24;
    __last.i._0_4_ = in_stack_ffffffffffffff20;
    std::sort<QList<QFileSystemModelPrivate::QFileSystemNode*>::iterator,QFileSystemModelSorter>
              (in_stack_ffffffffffffff28,__last,(QFileSystemModelSorter *)in_stack_ffffffffffffff08)
    ;
    QFileSystemModelSorter::~QFileSystemModelSorter((QFileSystemModelSorter *)0xaa6908);
    QList<QString>::clear
              ((QList<QString> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    *(int *)&pQVar3->field_0x48 = -1;
    pQVar3 = (QFileSystemModelPrivate *)&pQVar3->field_0x20;
    QList<QFileSystemModelPrivate::QFileSystemNode_*>::size(&local_40);
    QList<QString>::reserve((QList<QString> *)in_stack_ffffffffffffff28.i,(qsizetype)asize);
    local_68.i = (QFileSystemNode **)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = QList<QFileSystemModelPrivate::QFileSystemNode_*>::begin
                         ((QList<QFileSystemModelPrivate::QFileSystemNode_*> *)
                          CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    local_70.i = (QFileSystemNode **)&DAT_aaaaaaaaaaaaaaaa;
    local_70 = QList<QFileSystemModelPrivate::QFileSystemNode_*>::end
                         ((QList<QFileSystemModelPrivate::QFileSystemNode_*> *)
                          CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    while( true ) {
      local_78 = local_70.i;
      bVar1 = QList<QFileSystemModelPrivate::QFileSystemNode_*>::const_iterator::operator!=
                        (&local_68,local_70);
      if (!bVar1) break;
      ppQVar5 = QList<QFileSystemModelPrivate::QFileSystemNode_*>::const_iterator::operator*
                          (&local_68);
      pQVar6 = *ppQVar5;
      QList<QString>::append
                ((QList<QString> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (parameter_type)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      pQVar6->isVisible = true;
      QList<QFileSystemModelPrivate::QFileSystemNode_*>::const_iterator::operator++(&local_68);
    }
    if ((in_RDI->disableRecursiveSort & 1U) == 0) {
      iVar7 = 0;
      while (iVar8 = iVar7, iVar2 = (**(code **)(*(long *)parent_00 + 0x78))(parent_00,in_RDX),
            iVar7 < iVar2) {
        local_90 = &DAT_aaaaaaaaaaaaaaaa;
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_80 = &DAT_aaaaaaaaaaaaaaaa;
        (**(code **)(*(long *)parent_00 + 0x60))(&local_90,parent_00,iVar8,0,in_RDX);
        pQVar6 = QFileSystemModelPrivate::node
                           (pQVar3,(QModelIndex *)CONCAT44(iVar7,in_stack_ffffffffffffff00));
        if ((pQVar6->isVisible & 1U) != 0) {
          sortChildren((QFileSystemModelPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffff60),
                       (int)((ulong)in_RDX >> 0x20),parent_00);
        }
        iVar7 = iVar8 + 1;
      }
    }
    QFileSystemModelSorter::~QFileSystemModelSorter((QFileSystemModelSorter *)0xaa6aeb);
    QList<QFileSystemModelPrivate::QFileSystemNode_*>::~QList
              ((QList<QFileSystemModelPrivate::QFileSystemNode_*> *)0xaa6af8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileSystemModelPrivate::sortChildren(int column, const QModelIndex &parent)
{
    Q_Q(QFileSystemModel);
    QFileSystemModelPrivate::QFileSystemNode *indexNode = node(parent);
    if (indexNode->children.size() == 0)
        return;

    QList<QFileSystemModelPrivate::QFileSystemNode *> values;

    for (auto iterator = indexNode->children.constBegin(), cend = indexNode->children.constEnd(); iterator != cend; ++iterator) {
        if (filtersAcceptsNode(iterator.value())) {
            values.append(iterator.value());
        } else {
            iterator.value()->isVisible = false;
        }
    }
    QFileSystemModelSorter ms(column);
    std::sort(values.begin(), values.end(), ms);
    // First update the new visible list
    indexNode->visibleChildren.clear();
    //No more dirty item we reset our internal dirty index
    indexNode->dirtyChildrenIndex = -1;
    indexNode->visibleChildren.reserve(values.size());
    for (QFileSystemNode *node : std::as_const(values)) {
        indexNode->visibleChildren.append(node->fileName);
        node->isVisible = true;
    }

    if (!disableRecursiveSort) {
        for (int i = 0; i < q->rowCount(parent); ++i) {
            const QModelIndex childIndex = q->index(i, 0, parent);
            QFileSystemModelPrivate::QFileSystemNode *indexNode = node(childIndex);
            //Only do a recursive sort on visible nodes
            if (indexNode->isVisible)
                sortChildren(column, childIndex);
        }
    }
}